

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O1

void capnp::compiler::anon_unknown_0::buildTokenSequenceList
               (Builder builder,Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *items)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar1;
  Orphan<capnp::compiler::Token> *pOVar2;
  StructBuilder other;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  Builder itemBuilder;
  StructBuilder local_a8;
  StructBuilder local_80;
  ListBuilder local_58;
  
  if (items->size_ != 0) {
    uVar3 = 0;
    do {
      pAVar1 = items->ptr;
      local_80.data = builder.builder.ptr + (uVar3 * builder.builder.step >> 3);
      local_80.segment = builder.builder.segment;
      local_80.capTable = builder.builder.capTable;
      capnp::_::PointerBuilder::initStructList
                (&local_58,(PointerBuilder *)&local_80,(ElementCount)pAVar1[uVar3].size_,
                 (StructSize)0x10003);
      if (pAVar1[uVar3].size_ != 0) {
        uVar4 = 1;
        uVar5 = 0;
        do {
          pOVar2 = pAVar1[uVar3].ptr;
          capnp::_::ListBuilder::getStructElement(&local_80,&local_58,uVar4 - 1);
          capnp::_::OrphanBuilder::asStruct(&local_a8,&pOVar2[uVar5].builder,(StructSize)0x0);
          other.capTable = local_a8.capTable;
          other.segment = local_a8.segment;
          other.data = local_a8.data;
          other.pointers = local_a8.pointers;
          other.dataSize = local_a8.dataSize;
          other.pointerCount = local_a8.pointerCount;
          other._38_2_ = local_a8._38_2_;
          capnp::_::StructBuilder::transferContentFrom(&local_80,other);
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar5 < pAVar1[uVar3].size_);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < items->size_);
  }
  return;
}

Assistant:

void buildTokenSequenceList(List<List<Token>>::Builder builder,
                            kj::Array<kj::Array<Orphan<Token>>>&& items) {
  for (uint i = 0; i < items.size(); i++) {
    auto& item = items[i];
    auto itemBuilder = builder.init(i, item.size());
    for (uint j = 0; j < item.size(); j++) {
      itemBuilder.adoptWithCaveats(j, kj::mv(item[j]));
    }
  }
}